

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

void __thiscall CVmObjTable::gc_trace_globals(CVmObjTable *this)

{
  size_t sVar1;
  undefined4 id;
  size_t sVar2;
  CVmObjGlobPage *pCVar3;
  CVmObjTable *pCVar4;
  
  pCVar3 = (CVmObjGlobPage *)&this->globals_;
  while (pCVar3 = pCVar3->nxt_, pCVar3 != (CVmObjGlobPage *)0x0) {
    sVar1 = pCVar3->used_;
    for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
      add_to_gc_queue(this,pCVar3->objs_[sVar2],2);
    }
  }
  pCVar4 = this;
  id = r0_.val.obj;
  if (r0_.val.obj == 0 || r0_.typ != VM_OBJ) goto LAB_00266c7b;
  do {
    add_to_gc_queue(this,id,2);
LAB_00266c7b:
    do {
      pCVar4 = (CVmObjTable *)pCVar4->global_var_head_;
      if (pCVar4 == (CVmObjTable *)0x0) {
        return;
      }
    } while ((((vm_val_t *)&pCVar4->post_load_init_table_)->typ != VM_OBJ) ||
            (id = ((anon_union_8_8_cb74652f_for_val *)&pCVar4->globals_)->obj, id == 0));
  } while( true );
}

Assistant:

void CVmObjTable::gc_trace_globals(VMG0_)
{
    CVmObjGlobPage *pg;
    vm_val_t *val;
    vm_globalvar_t *var;

    /* trace each page of globals */
    for (pg = globals_ ; pg != 0 ; pg = pg->nxt_)
    {
        size_t i;
        vm_obj_id_t *objp;

        /* trace each item on this page */
        for (objp = pg->objs_, i = pg->used_ ; i != 0 ; ++objp, --i)
        {
            /* trace this global */
            add_to_gc_queue(*objp, VMOBJ_REACHABLE);
        }
    }

    /* the return value register (R0) is a machine global */
    val = G_interpreter->get_r0();
    if (val->typ == VM_OBJ && val->val.obj != VM_INVALID_OBJ)
        add_to_gc_queue(val->val.obj, VMOBJ_REACHABLE);

    /* trace the global variables defined by other subsystems */
    for (var = global_var_head_ ; var != 0 ; var = var->nxt)
    {
        /* if this global variable contains an object, trace it */
        if (var->val.typ == VM_OBJ && var->val.val.obj != VM_INVALID_OBJ)
            add_to_gc_queue(var->val.val.obj, VMOBJ_REACHABLE);
    }
}